

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<unsigned_long,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::HexIntegralOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  string_t *result_data_00;
  idx_t iVar3;
  void *dataptr_00;
  SelectionVector *pSVar4;
  ValidityMask *pVVar5;
  ValidityMask *result_mask;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  byte in_R8B;
  char in_R9B;
  uint uVar6;
  string_t sVar7;
  unsigned_long *ldata_3;
  string_t *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  unsigned_long *ldata_2;
  string_t *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  unsigned_long *ldata_1;
  string_t *result_data_1;
  unsigned_long *ldata;
  string_t *result_data;
  Vector *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  ValidityMask *in_stack_fffffffffffffe48;
  unsigned_long in_stack_fffffffffffffe50;
  optional_idx *in_stack_fffffffffffffe80;
  UnifiedVectorFormat *this;
  string_t *in_stack_fffffffffffffe98;
  unsigned_long *in_stack_fffffffffffffea0;
  undefined1 uVar9;
  string_t *psVar8;
  void *in_stack_fffffffffffffea8;
  ValidityMask *in_stack_fffffffffffffeb0;
  ValidityMask *in_stack_fffffffffffffeb8;
  idx_t in_stack_fffffffffffffec0;
  Vector *pVVar10;
  string_t *in_stack_fffffffffffffec8;
  unsigned_long *in_stack_fffffffffffffed0;
  UnifiedVectorFormat local_c8 [16];
  undefined1 local_b8 [56];
  SelectionVector *local_80;
  unsigned_long *local_78;
  string_t *local_70;
  Vector *local_68;
  optional_idx local_60;
  string_t *local_58;
  string_t *local_50;
  undefined8 local_48;
  char *local_40;
  unsigned_long *local_38;
  string_t *local_30;
  char local_22;
  byte local_21;
  UnifiedVectorFormat *local_18;
  Vector *local_10;
  Vector *local_8;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    uVar9 = (undefined1)((ulong)in_stack_fffffffffffffea0 >> 0x38);
    local_50 = FlatVector::GetData<duckdb::string_t>((Vector *)0xf1b245);
    result_data_00 = (string_t *)FlatVector::GetData<unsigned_long>((Vector *)0xf1b25a);
    psVar8 = local_50;
    local_58 = result_data_00;
    FlatVector::Validity((Vector *)0xf1b29f);
    FlatVector::Validity((Vector *)0xf1b2b4);
    ExecuteFlat<unsigned_long,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::HexIntegralOperator>>
              ((unsigned_long *)psVar8,result_data_00,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (bool)uVar9);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xf1b166);
    local_38 = ConstantVector::GetData<unsigned_long>((Vector *)0xf1b17b);
    bVar2 = ConstantVector::IsNull((Vector *)0xf1b190);
    if (bVar2) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      ConstantVector::Validity(local_10);
      sVar7 = GenericUnaryWrapper::
              Operation<duckdb::UnaryStringOperator<duckdb::HexIntegralOperator>,unsigned_long,duckdb::string_t>
                        (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                         in_stack_fffffffffffffe38);
      local_48 = sVar7.value._0_8_;
      *(undefined8 *)&local_30->value = local_48;
      local_40 = sVar7.value._8_8_;
      (local_30->value).pointer.ptr = local_40;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_60 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe38);
      bVar2 = optional_idx::IsValid(&local_60);
      if ((bVar2) &&
         (iVar3 = optional_idx::GetIndex(in_stack_fffffffffffffe80),
         (UnifiedVectorFormat *)(iVar3 * 2) < local_18 || (long)(iVar3 * 2) - (long)local_18 == 0))
      {
        local_68 = DictionaryVector::Child((Vector *)0xf1b35c);
        VVar1 = Vector::GetVectorType(local_68);
        if (VVar1 == FLAT_VECTOR) {
          local_70 = FlatVector::GetData<duckdb::string_t>((Vector *)0xf1b386);
          local_78 = FlatVector::GetData<unsigned_long>((Vector *)0xf1b39b);
          psVar8 = local_70;
          dataptr_00 = (void *)optional_idx::GetIndex(in_stack_fffffffffffffe80);
          uVar9 = (undefined1)((ulong)psVar8 >> 0x38);
          pVVar5 = FlatVector::Validity((Vector *)0xf1b3dc);
          FlatVector::Validity((Vector *)0xf1b3ee);
          ExecuteFlat<unsigned_long,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::HexIntegralOperator>>
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8,pVVar5,dataptr_00,(bool)uVar9);
          local_80 = DictionaryVector::SelVector((Vector *)0xf1b42e);
          pVVar10 = local_10;
          pSVar4 = (SelectionVector *)optional_idx::GetIndex(in_stack_fffffffffffffe80);
          duckdb::Vector::Dictionary(local_10,(ulong)pVVar10,pSVar4,(ulong)local_80);
          return;
        }
      }
    }
    this = local_c8;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    pSVar4 = (SelectionVector *)FlatVector::GetData<duckdb::string_t>((Vector *)0xf1b4e2);
    pVVar5 = (ValidityMask *)UnifiedVectorFormat::GetData<unsigned_long>(local_c8);
    uVar9 = (undefined1)((ulong)local_b8 >> 0x38);
    result_mask = FlatVector::Validity((Vector *)0xf1b565);
    uVar6 = local_21 & 1;
    ExecuteLoop<unsigned_long,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::HexIntegralOperator>>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,(idx_t)this,pSVar4,pVVar5,
               result_mask,in_stack_fffffffffffffeb0,(bool)uVar9);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe44,uVar6));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}